

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::~Map(Map *this)

{
  string *this_00;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *this_01;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_02;
  Map *this_local;
  
  this_00 = this->pMapTitle;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  this_01 = this->pMapContinents;
  if (this_01 != (vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *)0x0) {
    std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::~vector(this_01);
    operator_delete(this_01,0x18);
  }
  this_02 = this->pMapCountries;
  if (this_02 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::~vector(this_02);
    operator_delete(this_02,0x18);
  }
  return;
}

Assistant:

Map::~Map() {
    delete pMapTitle;
    delete pMapContinents;
    delete pMapCountries;
}